

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed,EnumValidityFunc *is_valid)

{
  byte in_CL;
  FieldType in_DL;
  byte in_R8B;
  void *in_R9;
  int in_stack_0000000c;
  MessageLite *in_stack_00000010;
  ExtensionInfo in_stack_00000020;
  ExtensionInfo info;
  LogMessage *in_stack_ffffffffffffff28;
  LogMessage *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  LogMessage *in_stack_ffffffffffffff40;
  undefined1 local_88 [55];
  byte local_51;
  void *local_18;
  byte local_f;
  byte local_e;
  FieldType local_d;
  
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_51 = 0;
  local_18 = in_R9;
  local_d = in_DL;
  if (in_DL != '\x0e') {
    LogMessage::LogMessage
              (in_stack_ffffffffffffff40,
               (LogLevel_conflict)((ulong)in_stack_ffffffffffffff38 >> 0x20),
               (char *)in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    local_51 = 1;
    LogMessage::operator<<(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    LogFinisher::operator=((LogFinisher *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x487241);
  }
  ExtensionInfo::ExtensionInfo
            ((ExtensionInfo *)local_88,local_d,(bool)(local_e & 1),(bool)(local_f & 1));
  local_88._8_8_ = CallNoArgValidityFunc;
  local_88._16_8_ = local_18;
  anon_unknown_19::Register(in_stack_00000010,in_stack_0000000c,in_stack_00000020);
  return;
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* containing_type,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         EnumValidityFunc* is_valid) {
  GOOGLE_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(type, is_repeated, is_packed);
  info.enum_validity_check.func = CallNoArgValidityFunc;
  // See comment in CallNoArgValidityFunc() about why we use a c-style cast.
  info.enum_validity_check.arg = (void*)is_valid;
  Register(containing_type, number, info);
}